

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.h
# Opt level: O0

void wasm::debuginfo::copyOriginalToReplacement
               (Expression *original,Expression *replacement,Function *func)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
  local_38;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
  local_30;
  iterator iter;
  unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
  *debugLocations;
  Function *func_local;
  Expression *replacement_local;
  Expression *original_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
             )&func->debugLocations;
  func_local = (Function *)replacement;
  replacement_local = original;
  bVar1 = std::
          unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
          ::empty((unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                   *)iter.
                     super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                     ._M_cur);
  if ((!bVar1) &&
     (sVar2 = std::
              unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
              ::count((unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                       *)iter.
                         super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                         ._M_cur,(key_type *)&func_local), sVar2 == 0)) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
         ::find(iter.
                super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                ._M_cur,&replacement_local);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
         ::end(iter.
               super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
               ._M_cur);
    bVar1 = std::__detail::operator!=(&local_30,&local_38);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false,_false>
                             *)&local_30);
      pmVar4 = std::
               unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
               ::operator[]((unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
                             *)iter.
                               super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                               ._M_cur,(key_type *)&func_local);
      *(undefined8 *)
       &(pmVar4->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
        super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
           *(undefined8 *)
            &(ppVar3->second).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
             _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload;
      *(undefined8 *)
       ((long)&(pmVar4->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
               super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8) =
           *(undefined8 *)
            ((long)&(ppVar3->second).super__Optional_base<wasm::Function::DebugLocation,_true,_true>
                    ._M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                    _M_payload + 8);
      *(undefined8 *)
       ((long)&(pmVar4->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
               super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
               symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) =
           *(undefined8 *)
            ((long)&(ppVar3->second).super__Optional_base<wasm::Function::DebugLocation,_true,_true>
                    ._M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                    _M_payload._M_value.symbolNameIndex.
                    super__Optional_base<unsigned_int,_true,_true> + 4);
    }
  }
  return;
}

Assistant:

inline void copyOriginalToReplacement(Expression* original,
                                      Expression* replacement,
                                      Function* func) {
  auto& debugLocations = func->debugLocations;
  // Early exit if there is no debug info at all. Also, leave if we already
  // have debug info on the new replacement, which we don't want to trample:
  // if there is no debug info we do want to copy, as a replacement operation
  // suggests the new code plays the same role (it is an optimized version of
  // the old), but if the code is already annotated, trust that.
  if (debugLocations.empty() || debugLocations.count(replacement)) {
    return;
  }

  auto iter = debugLocations.find(original);
  if (iter != debugLocations.end()) {
    debugLocations[replacement] = iter->second;
    // Note that we do *not* erase the debug info of the expression being
    // replaced, because it may still exist: we might replace
    //
    //  (call
    //    (block ..
    //
    // with
    //
    //  (block
    //    (call ..
    //
    // We still want the call here to have its old debug info.
    //
    // (In most cases, of course, we do remove the replaced expression,
    // which means we accumulate unused garbage in debugLocations, but
    // that's not that bad; we use arena allocation for Expressions, after
    // all.)
  }
}